

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# findMetadataFunctionNames.cpp
# Opt level: O3

void findMetadataFunctionNames(Module *module,Program *program)

{
  pointer psVar1;
  char *pcVar2;
  Program *this;
  char cVar3;
  bool bVar4;
  int iVar5;
  Module *pMVar6;
  Func *pFVar7;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar8;
  char *pcVar9;
  Function *pFVar10;
  Module *f;
  Function *pFVar11;
  Function *pFVar12;
  Function *pFVar13;
  long lVar14;
  undefined1 auVar15 [16];
  regex varName;
  undefined1 local_b8 [32];
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  long local_90;
  char local_88;
  undefined7 uStack_87;
  Program *local_78;
  Module *local_70;
  Module *local_68;
  Func *local_60;
  Function *local_58;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_50;
  
  pMVar6 = *(Module **)(module + 0x20);
  local_70 = module + 0x18;
  local_78 = program;
  if (pMVar6 != local_70) {
    do {
      f = pMVar6 + -0x38;
      if (pMVar6 == (Module *)0x0) {
        f = (Module *)0x0;
      }
      local_68 = pMVar6;
      cVar3 = llvm::GlobalValue::isDeclaration();
      this = local_78;
      if (cVar3 == '\0') {
        pFVar7 = Program::getFunction(local_78,(Function *)f);
        psVar8 = Program::getGlobalVarNames_abi_cxx11_(this);
        local_60 = pFVar7;
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_range_unique<std::_Rb_tree_const_iterator<std::__cxx11::string>>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&pFVar7->metadataVarNames,
                   (psVar8->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
                   (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )&(psVar8->_M_t)._M_impl.super__Rb_tree_header);
        pFVar10 = *(Function **)((Function *)f + 0x50);
        local_58 = (Function *)f + 0x48;
        if (pFVar10 != local_58) {
          do {
            pFVar12 = pFVar10 + -0x18;
            if (pFVar10 == (Function *)0x0) {
              pFVar12 = (Function *)0x0;
            }
            for (pFVar11 = *(Function **)(pFVar12 + 0x30); pFVar11 != pFVar12 + 0x28;
                pFVar11 = *(Function **)(pFVar11 + 8)) {
              pFVar13 = pFVar11 + -0x18;
              if (pFVar11 == (Function *)0x0) {
                pFVar13 = (Function *)0x0;
              }
              if ((((pFVar13[0x10] == (Function)0x53) &&
                   (lVar14 = *(long *)(pFVar13 + -0x20), lVar14 != 0)) &&
                  (*(char *)(lVar14 + 0x10) == '\0')) &&
                 (*(long *)(lVar14 + 0x18) == *(long *)(pFVar13 + 0x48))) {
                auVar15 = llvm::Value::getName();
                lVar14 = auVar15._0_8_;
                psVar1 = (pointer)(local_b8 + 0x10);
                local_b8._0_8_ = psVar1;
                if (lVar14 == 0) {
                  local_b8._8_8_ = (pointer)0x0;
                  local_b8._16_8_ = local_b8._16_8_ & 0xffffffffffffff00;
                }
                else {
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_b8,lVar14,auVar15._8_8_ + lVar14);
                }
                iVar5 = std::__cxx11::string::compare(local_b8);
                if ((pointer)local_b8._0_8_ != psVar1) {
                  operator_delete((void *)local_b8._0_8_,(ulong)(local_b8._16_8_ + 1));
                }
                if (iVar5 == 0) {
                  if ((*(uint *)(pFVar13 + 0x14) >> 0x1e & 1) == 0) {
                    lVar14 = (long)pFVar13 - (ulong)(*(uint *)(pFVar13 + 0x14) << 5);
                  }
                  else {
                    lVar14 = *(long *)(pFVar13 + -8);
                  }
                  lVar14 = *(long *)(lVar14 + 0x20);
                  if (*(char *)(lVar14 + 0x10) != '\x16') {
                    lVar14 = 0;
                  }
                  pcVar2 = *(char **)(lVar14 + 0x18);
                  pcVar9 = (char *)0x0;
                  if ((pcVar2 != (char *)0x0) && (pcVar9 = pcVar2, *pcVar2 != '\x19')) {
                    pcVar9 = (char *)0x0;
                  }
                  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                            (&local_50,"var[0-9]+",0x10);
                  if (*(long *)(pcVar9 + (ulong)*(uint *)(pcVar9 + 8) * -8 + 8) == 0) {
LAB_0015857c:
                    local_98._M_current = &local_88;
                    local_90 = 0;
                    local_88 = '\0';
                  }
                  else {
                    auVar15 = llvm::MDString::getString();
                    lVar14 = auVar15._0_8_;
                    if (lVar14 == 0) goto LAB_0015857c;
                    local_98._M_current = &local_88;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_98,lVar14,auVar15._8_8_ + lVar14);
                  }
                  local_b8._16_8_ = (pointer)0x0;
                  local_b8._24_8_ = (char *)0x0;
                  local_b8._0_8_ = (pointer)0x0;
                  local_b8._8_8_ = (pointer)0x0;
                  bVar4 = std::__detail::
                          __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                                    (local_98,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                               )(local_98._M_current + local_90),
                                     (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                      *)local_b8,&local_50,0);
                  if ((pointer)local_b8._0_8_ != (pointer)0x0) {
                    operator_delete((void *)local_b8._0_8_,local_b8._16_8_ - local_b8._0_8_);
                  }
                  if (local_98._M_current != &local_88) {
                    operator_delete(local_98._M_current,CONCAT71(uStack_87,local_88) + 1);
                  }
                  if (bVar4) {
                    psVar1 = (pointer)(local_b8 + 0x10);
                    if (*(long *)(pcVar9 + (ulong)*(uint *)(pcVar9 + 8) * -8 + 8) == 0) {
LAB_0015862a:
                      local_b8._8_8_ = (pointer)0x0;
                      local_b8._16_8_ = local_b8._16_8_ & 0xffffffffffffff00;
                      local_b8._0_8_ = psVar1;
                    }
                    else {
                      auVar15 = llvm::MDString::getString();
                      lVar14 = auVar15._0_8_;
                      if (lVar14 == 0) goto LAB_0015862a;
                      local_b8._0_8_ = psVar1;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_b8,lVar14,auVar15._8_8_ + lVar14);
                    }
                    Func::addMetadataVarName(local_60,(string *)local_b8);
                    if ((pointer)local_b8._0_8_ != psVar1) {
                      operator_delete((void *)local_b8._0_8_,(ulong)(local_b8._16_8_ + 1));
                    }
                  }
                  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                            (&local_50);
                }
              }
            }
            pFVar10 = *(Function **)(pFVar10 + 8);
          } while (pFVar10 != local_58);
        }
      }
      pMVar6 = *(Module **)(local_68 + 8);
    } while (pMVar6 != local_70);
  }
  Program::addPass(local_78,FindMetadataFunctionNames);
  return;
}

Assistant:

void findMetadataFunctionNames(const llvm::Module* module, Program& program) {
    assert(program.isPassCompleted(PassType::CreateFunctions));

    for (const llvm::Function& func : module->functions()) {
        if (func.isDeclaration())
            continue;

        auto function = program.getFunction(&func);
        assert(function && "Do not have function");

        function->fillMetadataVarNames(program.getGlobalVarNames());

        for (const llvm::BasicBlock& block : func) {
            for (const llvm::Instruction& ins : block) {
                if (ins.getOpcode() == llvm::Instruction::Call) {
                    const auto CI = llvm::cast<llvm::CallInst>(&ins);
                    if (CI->getCalledFunction() && CI->getCalledFunction()->getName().str().compare("llvm.dbg.declare") == 0) {
                        llvm::Metadata* varMD = llvm::dyn_cast_or_null<llvm::MetadataAsValue>(ins.getOperand(1))->getMetadata();
                        llvm::DILocalVariable* localVar = llvm::dyn_cast_or_null<llvm::DILocalVariable>(varMD);

                        std::regex varName("var[0-9]+");
                        if (std::regex_match(localVar->getName().str(), varName)) {
                            function->addMetadataVarName(localVar->getName().str());
                        }
                    }
                }
            }
        }
    }

    program.addPass(PassType::FindMetadataFunctionNames);
}